

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderAttributeCount(xmlTextReaderPtr reader)

{
  xmlNodePtr local_38;
  xmlNodePtr node;
  xmlNsPtr ns;
  xmlAttrPtr attr;
  int ret;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local._4_4_ = 0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      local_38 = reader->node;
    }
    else {
      local_38 = reader->curnode;
    }
    if (local_38->type == XML_ELEMENT_NODE) {
      if ((reader->state == XML_TEXTREADER_END) || (reader->state == XML_TEXTREADER_BACKTRACK)) {
        reader_local._4_4_ = 0;
      }
      else {
        attr._4_4_ = 0;
        for (ns = (xmlNsPtr)local_38->properties; ns != (xmlNsPtr)0x0; ns = ns[1].next) {
          attr._4_4_ = attr._4_4_ + 1;
        }
        for (node = (xmlNodePtr)local_38->nsDef; node != (xmlNodePtr)0x0;
            node = (xmlNodePtr)node->_private) {
          attr._4_4_ = attr._4_4_ + 1;
        }
        reader_local._4_4_ = attr._4_4_;
      }
    }
    else {
      reader_local._4_4_ = 0;
    }
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderAttributeCount(xmlTextReaderPtr reader) {
    int ret;
    xmlAttrPtr attr;
    xmlNsPtr ns;
    xmlNodePtr node;

    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(0);

    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    if (node->type != XML_ELEMENT_NODE)
	return(0);
    if ((reader->state == XML_TEXTREADER_END) ||
	(reader->state == XML_TEXTREADER_BACKTRACK))
	return(0);
    ret = 0;
    attr = node->properties;
    while (attr != NULL) {
	ret++;
	attr = attr->next;
    }
    ns = node->nsDef;
    while (ns != NULL) {
	ret++;
	ns = ns->next;
    }
    return(ret);
}